

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_serializer_test.cc
# Opt level: O2

void __thiscall
prometheus::anon_unknown_0::TextSerializerTest_shouldSerializeHistogramWithNoBuckets_Test::
~TextSerializerTest_shouldSerializeHistogramWithNoBuckets_Test
          (TextSerializerTest_shouldSerializeHistogramWithNoBuckets_Test *this)

{
  TextSerializerTest::~TextSerializerTest(&this->super_TextSerializerTest);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(TextSerializerTest, shouldSerializeHistogramWithNoBuckets) {
  metric.histogram.sample_count = 2;
  metric.histogram.sample_sum = 32.0;

  const auto serialized = Serialize(MetricType::Histogram);
  EXPECT_THAT(serialized, testing::HasSubstr(name + "_count 2"));
  EXPECT_THAT(serialized, testing::HasSubstr(name + "_sum 32\n"));
  EXPECT_THAT(serialized, testing::HasSubstr(name + "_bucket{le=\"+Inf\"} 2"));
}